

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void __thiscall
duckdb::WindowQuantileState<float>::WindowList<float,false>
          (WindowQuantileState<float> *this,CursorType *data,SubFrames *frames,idx_t n,Vector *list,
          idx_t lidx,QuantileBindData *bind_data)

{
  bool bVar1;
  uint64_t uVar2;
  size_type sVar3;
  reference puVar4;
  vector<duckdb::QuantileValue,_true> *in_RDI;
  Vector *in_R8;
  long in_R9;
  float fVar5;
  long in_stack_00000008;
  value_type *quantile;
  unsigned_long *q;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_long,_true> *__range3;
  float *rdata;
  Vector *result;
  list_entry_t *lentry;
  list_entry_t *ldata;
  WindowQuantileState<float> *in_stack_00000088;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  long local_58;
  float *local_50;
  undefined8 local_48;
  list_entry_t *local_40;
  list_entry_t *local_38;
  long local_30;
  Vector *local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_38 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0xaa3787);
  local_40 = local_38 + local_30;
  uVar2 = duckdb::ListVector::GetListSize(local_28);
  local_40->offset = uVar2;
  sVar3 = std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::size
                    ((vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_> *)
                     (in_stack_00000008 + 8));
  local_40->length = sVar3;
  duckdb::ListVector::Reserve(local_28,local_40->offset + local_40->length);
  duckdb::ListVector::SetListSize(local_28,local_40->offset + local_40->length);
  local_48 = duckdb::ListVector::GetEntry(local_28);
  local_50 = FlatVector::GetData<float>((Vector *)0xaa3823);
  local_58 = in_stack_00000008 + 0x20;
  local_60._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_60);
    vector<duckdb::QuantileValue,_true>::operator[](in_RDI,(size_type)in_stack_ffffffffffffff78);
    fVar5 = WindowScalar<float,false>
                      (in_stack_00000088,(CursorType *)this,(SubFrames *)data,(idx_t)frames,
                       (Vector *)n,(QuantileValue *)list);
    local_50[local_40->offset + *puVar4] = fVar5;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_60);
  }
  return;
}

Assistant:

void WindowList(CursorType &data, const SubFrames &frames, const idx_t n, Vector &list, const idx_t lidx,
	                const QuantileBindData &bind_data) const {
		D_ASSERT(n > 0);
		// Result is a constant LIST<CHILD_TYPE> with a fixed length
		auto ldata = FlatVector::GetData<list_entry_t>(list);
		auto &lentry = ldata[lidx];
		lentry.offset = ListVector::GetListSize(list);
		lentry.length = bind_data.quantiles.size();

		ListVector::Reserve(list, lentry.offset + lentry.length);
		ListVector::SetListSize(list, lentry.offset + lentry.length);
		auto &result = ListVector::GetEntry(list);
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			rdata[lentry.offset + q] = WindowScalar<CHILD_TYPE, DISCRETE>(data, frames, n, result, quantile);
		}
	}